

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::TypedExpectation<int_(StrictMockProblemBuilder_&,_mp::SolutionHandler_&)>::
ExplainMatchResultTo
          (TypedExpectation<int_(StrictMockProblemBuilder_&,_mp::SolutionHandler_&)> *this,
          ArgumentTuple *args,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  const_iterator this_00;
  const_iterator os_00;
  pointer this_01;
  linked_ptr<testing::internal::ExpectationBase> *this_02;
  ostream *in_RDX;
  const_iterator it;
  int i;
  ExpectationSet unsatisfied_prereqs;
  StringMatchResultListener listener;
  StringMatchResultListener *in_stack_fffffffffffffd88;
  StringMatchResultListener *in_stack_fffffffffffffd90;
  ExpectationBase *in_stack_fffffffffffffd98;
  TypedExpectation<int_(StrictMockProblemBuilder_&,_mp::SolutionHandler_&)>
  *in_stack_fffffffffffffda0;
  StringMatchResultListener *in_stack_fffffffffffffdb0;
  MutexBase *in_stack_fffffffffffffdc0;
  int local_214;
  string local_1e0 [456];
  ostream *local_18;
  
  local_18 = in_RDX;
  MutexBase::AssertHeld(in_stack_fffffffffffffdc0);
  bVar1 = ExpectationBase::is_retired((ExpectationBase *)in_stack_fffffffffffffd90);
  if (bVar1) {
    poVar2 = std::operator<<(local_18,"         Expected: the expectation is active\n");
    std::operator<<(poVar2,"           Actual: it is retired\n");
  }
  else {
    bVar1 = Matches(in_stack_fffffffffffffda0,(ArgumentTuple *)in_stack_fffffffffffffd98);
    if (bVar1) {
      bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied(in_stack_fffffffffffffd98);
      if (bVar1) {
        std::operator<<(local_18,"The call matches the expectation.\n");
      }
      else {
        poVar2 = std::operator<<(local_18,"         Expected: all pre-requisites are satisfied\n");
        poVar2 = std::operator<<(poVar2,"           Actual: the following immediate pre-requisites "
                                );
        std::operator<<(poVar2,"are not satisfied:\n");
        ExpectationSet::ExpectationSet((ExpectationSet *)0x169996);
        ExpectationBase::FindUnsatisfiedPrerequisites
                  (&in_stack_fffffffffffffda0->super_ExpectationBase,
                   (ExpectationSet *)in_stack_fffffffffffffd98);
        local_214 = 0;
        this_00 = ExpectationSet::begin((ExpectationSet *)in_stack_fffffffffffffd88);
        while( true ) {
          os_00 = ExpectationSet::end((ExpectationSet *)in_stack_fffffffffffffd88);
          bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffde0,
                                  (_Self *)&stack0xfffffffffffffdd8);
          if (!bVar1) break;
          this_01 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->
                              ((_Rb_tree_const_iterator<testing::Expectation> *)
                               in_stack_fffffffffffffd90);
          this_02 = Expectation::expectation_base(this_01);
          linked_ptr<testing::internal::ExpectationBase>::operator->(this_02);
          ExpectationBase::DescribeLocationTo
                    ((ExpectationBase *)this_00._M_node,(ostream *)os_00._M_node);
          in_stack_fffffffffffffd90 =
               (StringMatchResultListener *)std::operator<<(local_18,"pre-requisite #");
          in_stack_fffffffffffffd88 =
               (StringMatchResultListener *)
               std::ostream::operator<<(in_stack_fffffffffffffd90,local_214);
          std::operator<<((ostream *)in_stack_fffffffffffffd88,"\n");
          std::_Rb_tree_const_iterator<testing::Expectation>::operator++
                    ((_Rb_tree_const_iterator<testing::Expectation> *)in_stack_fffffffffffffd90);
          local_214 = local_214 + 1;
        }
        std::operator<<(local_18,"                   (end of pre-requisites)\n");
        ExpectationSet::~ExpectationSet((ExpectationSet *)0x169ad5);
      }
    }
    else {
      bVar1 = TupleMatches<std::tuple<testing::Matcher<StrictMockProblemBuilder&>,testing::Matcher<mp::SolutionHandler&>>,std::tuple<StrictMockProblemBuilder&,mp::SolutionHandler&>>
                        ((tuple<testing::Matcher<StrictMockProblemBuilder_&>,_testing::Matcher<mp::SolutionHandler_&>_>
                          *)in_stack_fffffffffffffd90,
                         (tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&> *)
                         in_stack_fffffffffffffd88);
      if (!bVar1) {
        ExplainMatchFailureTupleTo<std::tuple<testing::Matcher<StrictMockProblemBuilder&>,testing::Matcher<mp::SolutionHandler&>>,std::tuple<StrictMockProblemBuilder&,mp::SolutionHandler&>>
                  ((tuple<testing::Matcher<StrictMockProblemBuilder_&>,_testing::Matcher<mp::SolutionHandler_&>_>
                    *)in_stack_fffffffffffffd90,
                   (tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&> *)
                   in_stack_fffffffffffffd88,(ostream *)0x169808);
      }
      StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffdb0);
      bVar1 = MatcherBase<const_std::tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&>_&>::
              MatchAndExplain((MatcherBase<const_std::tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&>_&>
                               *)in_stack_fffffffffffffd90,
                              (tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&> *)
                              in_stack_fffffffffffffd88,(MatchResultListener *)0x169838);
      if (!bVar1) {
        std::operator<<(local_18,"    Expected args: ");
        MatcherBase<const_std::tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&>_&>::
        DescribeTo((MatcherBase<const_std::tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&>_&>
                    *)in_stack_fffffffffffffd90,(ostream *)in_stack_fffffffffffffd88);
        std::operator<<(local_18,"\n           Actual: don\'t match");
        StringMatchResultListener::str_abi_cxx11_(in_stack_fffffffffffffd88);
        PrintIfNotEmpty((string *)in_stack_fffffffffffffd90,(ostream *)in_stack_fffffffffffffd88);
        std::__cxx11::string::~string(local_1e0);
        std::operator<<(local_18,"\n");
      }
      StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffd90);
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    if (is_retired()) {
      *os << "         Expected: the expectation is active\n"
          << "           Actual: it is retired\n";
    } else if (!Matches(args)) {
      if (!TupleMatches(matchers_, args)) {
        ExplainMatchFailureTupleTo(matchers_, args, os);
      }
      StringMatchResultListener listener;
      if (!extra_matcher_.MatchAndExplain(args, &listener)) {
        *os << "    Expected args: ";
        extra_matcher_.DescribeTo(os);
        *os << "\n           Actual: don't match";

        internal::PrintIfNotEmpty(listener.str(), os);
        *os << "\n";
      }
    } else if (!AllPrerequisitesAreSatisfied()) {
      *os << "         Expected: all pre-requisites are satisfied\n"
          << "           Actual: the following immediate pre-requisites "
          << "are not satisfied:\n";
      ExpectationSet unsatisfied_prereqs;
      FindUnsatisfiedPrerequisites(&unsatisfied_prereqs);
      int i = 0;
      for (ExpectationSet::const_iterator it = unsatisfied_prereqs.begin();
           it != unsatisfied_prereqs.end(); ++it) {
        it->expectation_base()->DescribeLocationTo(os);
        *os << "pre-requisite #" << i++ << "\n";
      }
      *os << "                   (end of pre-requisites)\n";
    } else {
      // This line is here just for completeness' sake.  It will never
      // be executed as currently the ExplainMatchResultTo() function
      // is called only when the mock function call does NOT match the
      // expectation.
      *os << "The call matches the expectation.\n";
    }
  }